

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void basic_test(void)

{
  fdb_status fVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  void *pvVar6;
  fdb_kvs_handle *in_stack_fffffffffffffa48;
  fdb_file_handle *in_stack_fffffffffffffa50;
  fdb_doc **in_stack_fffffffffffffa58;
  void *in_stack_fffffffffffffa60;
  fdb_doc **in_stack_fffffffffffffa68;
  size_t in_stack_fffffffffffffa70;
  fdb_file_info *in_stack_fffffffffffffa80;
  fdb_file_handle *in_stack_fffffffffffffa88;
  fdb_doc *in_stack_fffffffffffffaa0;
  fdb_kvs_handle *in_stack_fffffffffffffaa8;
  fdb_file_info info;
  char *file_version;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char *version;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *db_rdonly;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile_rdonly;
  fdb_file_handle *dbfile;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  pcVar3 = fdb_get_lib_version();
  if ((pcVar3 == (char *)0x0) || (sVar4 = strlen(pcVar3), sVar4 == 0)) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x37);
    basic_test::__test_pass = 0;
    bVar5 = false;
    if (pcVar3 != (char *)0x0) {
      sVar4 = strlen(pcVar3);
      bVar5 = sVar4 != 0;
    }
    if (!bVar5) {
      __assert_fail("version != __null && strlen(version) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x37,"void basic_test()");
    }
  }
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fVar1 = fdb_open((fdb_file_handle **)bodybuf._24_8_,(char *)bodybuf._16_8_,
                   (fdb_config *)bodybuf._8_8_);
  if (fVar1 != FDB_RESULT_NO_SUCH_FILE) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x43);
    basic_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_NO_SUCH_FILE) {
      __assert_fail("status == FDB_RESULT_NO_SUCH_FILE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x43,"void basic_test()");
    }
  }
  pcVar3 = fdb_error_msg(fVar1);
  iVar2 = strcmp(pcVar3,"no such file");
  if (iVar2 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x44);
    basic_test::__test_pass = 0;
    pcVar3 = fdb_error_msg(fVar1);
    iVar2 = strcmp(pcVar3,"no such file");
    if (iVar2 != 0) {
      __assert_fail("!strcmp(fdb_error_msg(status), \"no such file\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x44,"void basic_test()");
    }
  }
  fVar1 = fdb_open((fdb_file_handle **)bodybuf._24_8_,(char *)bodybuf._16_8_,
                   (fdb_config *)bodybuf._8_8_);
  if (fVar1 != FDB_RESULT_NO_SUCH_FILE) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x49);
    basic_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_NO_SUCH_FILE) {
      __assert_fail("status == FDB_RESULT_NO_SUCH_FILE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x49,"void basic_test()");
    }
  }
  fVar1 = fdb_open((fdb_file_handle **)bodybuf._24_8_,(char *)bodybuf._16_8_,
                   (fdb_config *)bodybuf._8_8_);
  if (fVar1 != FDB_RESULT_INVALID_CONFIG) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x4e);
    basic_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_INVALID_CONFIG) {
      __assert_fail("status == FDB_RESULT_INVALID_CONFIG",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x4e,"void basic_test()");
    }
  }
  pcVar3 = fdb_error_msg(fVar1);
  iVar2 = strcmp(pcVar3,"invalid configuration");
  if (iVar2 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x4f);
    basic_test::__test_pass = 0;
    pcVar3 = fdb_error_msg(fVar1);
    iVar2 = strcmp(pcVar3,"invalid configuration");
    if (iVar2 != 0) {
      __assert_fail("!strcmp(fdb_error_msg(status), \"invalid configuration\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x4f,"void basic_test()");
    }
  }
  fVar1 = fdb_open((fdb_file_handle **)bodybuf._24_8_,(char *)bodybuf._16_8_,
                   (fdb_config *)bodybuf._8_8_);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x54);
    basic_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x54,"void basic_test()");
    }
  }
  pcVar3 = fdb_error_msg(fVar1);
  iVar2 = strcmp(pcVar3,"success");
  if (iVar2 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x55);
    basic_test::__test_pass = 0;
    pcVar3 = fdb_error_msg(fVar1);
    iVar2 = strcmp(pcVar3,"success");
    if (iVar2 != 0) {
      __assert_fail("!strcmp(fdb_error_msg(status), \"success\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x55,"void basic_test()");
    }
  }
  pcVar3 = fdb_get_file_version((fdb_file_handle *)in_stack_fffffffffffffa48);
  if ((pcVar3 == (char *)0x0) || (sVar4 = strlen(pcVar3), sVar4 == 0)) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x57);
    basic_test::__test_pass = 0;
    bVar5 = false;
    if (pcVar3 != (char *)0x0) {
      sVar4 = strlen(pcVar3);
      bVar5 = sVar4 != 0;
    }
    if (!bVar5) {
      __assert_fail("file_version != __null && strlen(file_version) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x57,"void basic_test()");
    }
  }
  fdb_close((fdb_file_handle *)in_stack_fffffffffffffa48);
  system("rm -rf  dummy* > errorlog.txt");
  fdb_open((fdb_file_handle **)bodybuf._24_8_,(char *)bodybuf._16_8_,(fdb_config *)bodybuf._8_8_);
  fdb_kvs_open_default
            (in_stack_fffffffffffffa50,(fdb_kvs_handle **)in_stack_fffffffffffffa48,
             (fdb_kvs_config *)0x105700);
  pvVar6 = (void *)0x105717;
  fVar1 = fdb_set_log_callback(db_rdonly,logCallbackFunc,"basic_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pvVar6 = (void *)0x10574a;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x60);
    basic_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x60,"void basic_test()");
    }
  }
  for (n = 0; n < 10; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&version,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar6 = (void *)0x105850;
    sVar4 = strlen((char *)&version);
    fdb_doc_create(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                   (size_t)in_stack_fffffffffffffa48,pvVar6,sVar4,(void *)0x105887,
                   in_stack_fffffffffffffa70);
    pvVar6 = (void *)0x1058a3;
    fdb_set(db_rdonly,*(fdb_doc **)(&stack0xfffffffffffffa48 + (long)n * 8));
  }
  fdb_doc_create(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                 (size_t)in_stack_fffffffffffffa48,pvVar6,0,(void *)0x105909,
                 in_stack_fffffffffffffa70);
  fVar1 = fdb_del(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x70);
    basic_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x70,"void basic_test()");
    }
  }
  fdb_doc_free((fdb_doc *)0x105992);
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffffa48,'\0');
  pvVar6 = (void *)0x1059b8;
  fdb_get_file_info(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
  if (info.new_filename != (char *)((long)&sRam0000000000000008 + 1)) {
    pvVar6 = (void *)0x1059e6;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x7a);
    basic_test::__test_pass = 0;
    if (info.new_filename != (char *)((long)&sRam0000000000000008 + 1)) {
      __assert_fail("info.doc_count == 9",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x7a,"void basic_test()");
    }
  }
  if (info.doc_count != 1) {
    pvVar6 = (void *)0x105a4b;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x7b);
    basic_test::__test_pass = 0;
    if (info.doc_count != 1) {
      __assert_fail("info.deleted_count == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x7b,"void basic_test()");
    }
  }
  if (info.deleted_count == 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x7c);
    basic_test::__test_pass = 0;
    __assert_fail("info.space_used > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x7c,"void basic_test()");
  }
  if (info.file_size != 1) {
    pvVar6 = (void *)0x105b15;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x7d);
    basic_test::__test_pass = 0;
    if (info.file_size != 1) {
      __assert_fail("info.num_kv_stores == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x7d,"void basic_test()");
    }
  }
  fdb_doc_create(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                 (size_t)in_stack_fffffffffffffa48,pvVar6,0,(void *)0x105b8c,
                 in_stack_fffffffffffffa70);
  fVar1 = fdb_get_metaonly(db_rdonly,(fdb_doc *)0x0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x81);
    basic_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x81,"void basic_test()");
    }
  }
  if ((bRam0000000000000048 & 1) != 1) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x82);
    basic_test::__test_pass = 0;
    if ((bRam0000000000000048 & 1) != 1) {
      __assert_fail("rdoc->deleted == true",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x82,"void basic_test()");
    }
  }
  iVar2 = memcmp(pvRam0000000000000038,*(void **)(in_stack_fffffffffffffa70 + 0x38),
                 sRam0000000000000008);
  if (iVar2 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)(in_stack_fffffffffffffa70 + 0x38),pvRam0000000000000038,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x83);
    basic_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x83,"void basic_test()");
  }
  fdb_doc_free((fdb_doc *)0x105d25);
  fdb_kvs_close(in_stack_fffffffffffffa48);
  fdb_close((fdb_file_handle *)in_stack_fffffffffffffa48);
  fdb_open((fdb_file_handle **)bodybuf._24_8_,(char *)bodybuf._16_8_,(fdb_config *)bodybuf._8_8_);
  fdb_kvs_open_default
            (in_stack_fffffffffffffa50,(fdb_kvs_handle **)in_stack_fffffffffffffa48,
             (fdb_kvs_config *)0x105d6d);
  fVar1 = fdb_set_log_callback(db_rdonly,logCallbackFunc,"basic_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x8f);
    basic_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x8f,"void basic_test()");
    }
  }
  for (n = 0; n < 2; n = n + 1) {
    sprintf(bodybuf + 0xf8,"meta2%d",(ulong)(uint)n);
    sprintf((char *)&version,"body2%d",(ulong)(uint)n);
    strlen(bodybuf + 0xf8);
    strlen((char *)&version);
    fdb_doc_update(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                   (size_t)in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                   (size_t)in_stack_fffffffffffffa48);
    fdb_set(db_rdonly,*(fdb_doc **)(&stack0xfffffffffffffa48 + (long)n * 8));
  }
  pvVar6 = (void *)0x105ed7;
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffffa48,'\0');
  n = 0;
  do {
    if (9 < n) {
      pvVar6 = (void *)0x10622e;
      fdb_compact(in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48);
      n = 0;
      do {
        if (9 < n) {
          n = 0;
          do {
            if (0xc < n) {
              fdb_doc_create(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                             (size_t)in_stack_fffffffffffffa48,pvVar6,0,(void *)0x1066b4,
                             in_stack_fffffffffffffa70);
              fVar1 = fdb_set(db_rdonly,(fdb_doc *)0x0);
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xe2);
                basic_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xe2,"void basic_test()");
                }
              }
              fdb_doc_free((fdb_doc *)0x10673d);
              pvVar6 = (void *)0x106753;
              fdb_commit((fdb_file_handle *)in_stack_fffffffffffffa48,'\0');
              fdb_doc_create(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                             (size_t)in_stack_fffffffffffffa48,pvVar6,0,(void *)0x106793,
                             in_stack_fffffffffffffa70);
              fVar1 = fdb_get(db_rdonly,(fdb_doc *)0x0);
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xea);
                basic_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xea,"void basic_test()");
                }
              }
              iVar2 = memcmp(pvRam0000000000000038,*(void **)(in_stack_fffffffffffffa70 + 0x38),
                             sRam0000000000000008);
              if (iVar2 != 0) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xeb);
                basic_test::__test_pass = 0;
                iVar2 = memcmp(pvRam0000000000000038,*(void **)(in_stack_fffffffffffffa70 + 0x38),
                               sRam0000000000000008);
                if (iVar2 != 0) {
                  __assert_fail("memcmp(rdoc->meta, doc[5]->meta, rdoc->metalen) == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xeb,"void basic_test()");
                }
              }
              if (pvRam0000000000000040 != (void *)0x0) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xec);
                basic_test::__test_pass = 0;
                if (pvRam0000000000000040 != (void *)0x0) {
                  __assert_fail("rdoc->body == __null",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xec,"void basic_test()");
                }
              }
              if (sRam0000000000000010 != 0) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xed);
                basic_test::__test_pass = 0;
                if (sRam0000000000000010 != 0) {
                  __assert_fail("rdoc->bodylen == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xed,"void basic_test()");
                }
              }
              fdb_doc_free((fdb_doc *)0x1069a9);
              fVar1 = fdb_open((fdb_file_handle **)bodybuf._24_8_,(char *)bodybuf._16_8_,
                               (fdb_config *)bodybuf._8_8_);
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xf4);
                basic_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xf4,"void basic_test()");
                }
              }
              pvVar6 = (void *)0x106a52;
              fVar1 = fdb_kvs_open_default
                                (in_stack_fffffffffffffa50,
                                 (fdb_kvs_handle **)in_stack_fffffffffffffa48,
                                 (fdb_kvs_config *)0x106a52);
              if (fVar1 != FDB_RESULT_SUCCESS) {
                pvVar6 = (void *)0x106a85;
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xf6);
                basic_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xf6,"void basic_test()");
                }
              }
              fdb_doc_create(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                             (size_t)in_stack_fffffffffffffa48,pvVar6,0,(void *)0x106af9,
                             in_stack_fffffffffffffa70);
              fVar1 = fdb_get((fdb_kvs_handle *)doc,(fdb_doc *)0x0);
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xfa);
                basic_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xfa,"void basic_test()");
                }
              }
              fVar1 = fdb_set_log_callback((fdb_kvs_handle *)doc,logCallbackFunc,"basic_test");
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xfe);
                basic_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xfe,"void basic_test()");
                }
              }
              fVar1 = fdb_set((fdb_kvs_handle *)doc,
                              *(fdb_doc **)(&stack0xfffffffffffffa48 + (long)n * 8));
              if (fVar1 != FDB_RESULT_RONLY_VIOLATION) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x101);
                basic_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_RONLY_VIOLATION) {
                  __assert_fail("status == FDB_RESULT_RONLY_VIOLATION",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0x101,"void basic_test()");
                }
              }
              pcVar3 = fdb_error_msg(fVar1);
              iVar2 = strcmp(pcVar3,"database is read-only");
              if (iVar2 != 0) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x102);
                basic_test::__test_pass = 0;
                pcVar3 = fdb_error_msg(fVar1);
                iVar2 = strcmp(pcVar3,"database is read-only");
                if (iVar2 != 0) {
                  __assert_fail("!strcmp(fdb_error_msg(status), \"database is read-only\")",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0x102,"void basic_test()");
                }
              }
              fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffa48,'\0');
              if (fVar1 != FDB_RESULT_RONLY_VIOLATION) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x105);
                basic_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_RONLY_VIOLATION) {
                  __assert_fail("status == FDB_RESULT_RONLY_VIOLATION",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0x105,"void basic_test()");
                }
              }
              fdb_doc_free((fdb_doc *)0x106d8f);
              fdb_kvs_close(in_stack_fffffffffffffa48);
              fdb_close((fdb_file_handle *)in_stack_fffffffffffffa48);
              for (n = 0; n < 10; n = n + 1) {
                fdb_doc_free((fdb_doc *)0x106dcf);
              }
              fdb_compact(in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48);
              fdb_kvs_close(in_stack_fffffffffffffa48);
              fdb_close((fdb_file_handle *)in_stack_fffffffffffffa48);
              fdb_shutdown();
              memleak_end();
              if (basic_test::__test_pass == 0) {
                fprintf(_stderr,"%s FAILED\n","basic test");
              }
              else {
                fprintf(_stderr,"%s PASSED\n","basic test");
              }
              return;
            }
            fdb_doc_create(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                           (size_t)in_stack_fffffffffffffa48,pvVar6,0,(void *)0x10651b,
                           in_stack_fffffffffffffa70);
            lRam0000000000000028 = (long)(n + 1);
            fVar1 = fdb_get_byseq(db_rdonly,(fdb_doc *)0x0);
            if ((((n < 2) || (4 < n)) && ((n < 6 || (9 < n)))) && ((n < 0xb || (0xc < n)))) {
              if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xd6);
                basic_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
                  __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0xd6,"void basic_test()");
                }
              }
            }
            else if (fVar1 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xd3);
              basic_test::__test_pass = 0;
              if (fVar1 != FDB_RESULT_SUCCESS) {
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0xd3,"void basic_test()");
              }
            }
            pvVar6 = (void *)0x106643;
            fdb_doc_free((fdb_doc *)0x106643);
            n = n + 1;
          } while( true );
        }
        fdb_doc_create(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                       (size_t)in_stack_fffffffffffffa48,pvVar6,0,(void *)0x106289,
                       in_stack_fffffffffffffa70);
        fVar1 = fdb_get(db_rdonly,(fdb_doc *)0x0);
        if (n == 5) {
          if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xc3);
            basic_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
              __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xc3,"void basic_test()");
            }
          }
        }
        else {
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xbe);
            basic_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xbe,"void basic_test()");
            }
          }
          iVar2 = memcmp(pvRam0000000000000038,
                         *(void **)(*(long *)(&stack0xfffffffffffffa48 + (long)n * 8) + 0x38),
                         sRam0000000000000008);
          if (iVar2 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                    *(undefined8 *)(*(long *)(&stack0xfffffffffffffa48 + (long)n * 8) + 0x38),
                    pvRam0000000000000038,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xbf);
            basic_test::__test_pass = 0;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xbf,"void basic_test()");
          }
          iVar2 = memcmp(pvRam0000000000000040,
                         *(void **)(*(long *)(&stack0xfffffffffffffa48 + (long)n * 8) + 0x40),
                         sRam0000000000000010);
          if (iVar2 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                    *(undefined8 *)(*(long *)(&stack0xfffffffffffffa48 + (long)n * 8) + 0x40),
                    pvRam0000000000000040,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xc0);
            basic_test::__test_pass = 0;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xc0,"void basic_test()");
          }
        }
        pvVar6 = (void *)0x1064c1;
        fdb_doc_free((fdb_doc *)0x1064c1);
        n = n + 1;
      } while( true );
    }
    fdb_doc_create(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                   (size_t)in_stack_fffffffffffffa48,pvVar6,0,(void *)0x105f32,
                   in_stack_fffffffffffffa70);
    fVar1 = fdb_get(db_rdonly,(fdb_doc *)0x0);
    if (n == 5) {
      if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xaa);
        basic_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
          __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xaa,"void basic_test()");
        }
      }
      pcVar3 = fdb_error_msg(fVar1);
      iVar2 = strcmp(pcVar3,"key not found");
      if (iVar2 != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xab);
        basic_test::__test_pass = 0;
        pcVar3 = fdb_error_msg(fVar1);
        iVar2 = strcmp(pcVar3,"key not found");
        if (iVar2 != 0) {
          __assert_fail("!strcmp(fdb_error_msg(status), \"key not found\")",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xab,"void basic_test()");
        }
      }
    }
    else {
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xa5);
        basic_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xa5,"void basic_test()");
        }
      }
      iVar2 = memcmp(pvRam0000000000000038,
                     *(void **)(*(long *)(&stack0xfffffffffffffa48 + (long)n * 8) + 0x38),
                     sRam0000000000000008);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                *(undefined8 *)(*(long *)(&stack0xfffffffffffffa48 + (long)n * 8) + 0x38),
                pvRam0000000000000038,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xa6);
        basic_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xa6,"void basic_test()");
      }
      iVar2 = memcmp(pvRam0000000000000040,
                     *(void **)(*(long *)(&stack0xfffffffffffffa48 + (long)n * 8) + 0x40),
                     sRam0000000000000010);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                *(undefined8 *)(*(long *)(&stack0xfffffffffffffa48 + (long)n * 8) + 0x40),
                pvRam0000000000000040,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xa7);
        basic_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xa7,"void basic_test()");
      }
    }
    pvVar6 = (void *)0x106205;
    fdb_doc_free((fdb_doc *)0x106205);
    n = n + 1;
  } while( true );
}

Assistant:

void basic_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile, *dbfile_rdonly;
    fdb_kvs_handle *db;
    fdb_kvs_handle *db_rdonly;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy test files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    // Get the ForestDB version
    const char *version = fdb_get_lib_version();
    TEST_CHK(version != NULL && strlen(version) > 0);

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.compaction_threshold = 0;
    fconfig.purging_interval = 1;

    // Read-Write mode test without a create flag.
    fconfig.flags = 0;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);
    TEST_CHK(!strcmp(fdb_error_msg(status), "no such file"));

    // Read-Only mode test: Must not create new file.
    fconfig.flags = FDB_OPEN_FLAG_RDONLY;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);

    // Read-Only and Create mode: Must not create a new file.
    fconfig.flags = FDB_OPEN_FLAG_RDONLY | FDB_OPEN_FLAG_CREATE;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_CONFIG);
    TEST_CHK(!strcmp(fdb_error_msg(status), "invalid configuration"));

    // open and close db with a create flag.
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(!strcmp(fdb_error_msg(status), "success"));
    const char *file_version = fdb_get_file_version(dbfile);
    TEST_CHK(file_version != NULL && strlen(file_version) > 0);
    fdb_close(dbfile);

    // reopen db
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;
    fdb_open(&dbfile, "./dummy1",&fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc, (void *) "basic_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove document #5
    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, doc[5]->meta,
                   doc[5]->metalen, NULL, 0);
    status = fdb_del(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // check the file info
    fdb_file_info info;
    fdb_get_file_info(dbfile, &info);
    TEST_CHK(info.doc_count == 9);
    TEST_CHK(info.deleted_count == 1);
    TEST_CHK(info.space_used > 0);
    TEST_CHK(info.num_kv_stores == 1);

    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, NULL, 0, NULL, 0);
    status = fdb_get_metaonly(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(rdoc->deleted == true);
    TEST_CMP(rdoc->meta, doc[5]->meta, rdoc->metalen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // close the db
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc, (void *) "basic_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // update document #0 and #1
    for (i=0;i<2;++i){
        sprintf(metabuf, "meta2%d", i);
        sprintf(bodybuf, "body2%d", i);
        fdb_doc_update(&doc[i], (void *)metabuf, strlen(metabuf),
            (void *)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // retrieve documents
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
            TEST_CHK(!strcmp(fdb_error_msg(status), "key not found"));
        }

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    // retrieve documents after compaction
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // retrieve documents by sequence number
    for (i=0; i < n+3; ++i){
        // search by seq
        fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
        rdoc->seqnum = i + 1;
        status = fdb_get_byseq(db, rdoc);
        if ( (i>=2 && i<=4) || (i>=6 && i<=9) || (i>=11 && i<=12)) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // update document #5 with an empty doc body.
    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, doc[5]->meta,
                   doc[5]->metalen, NULL, 0);
    status = fdb_set(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);
    rdoc = NULL;
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // Check document #5 with respect to metadata and doc body.
    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, NULL, 0, NULL, 0);
    status = fdb_get(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(memcmp(rdoc->meta, doc[5]->meta, rdoc->metalen) == 0);
    TEST_CHK(rdoc->body == NULL);
    TEST_CHK(rdoc->bodylen == 0);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // Read-Only mode test: Open succeeds if file exists, but disallow writes
    fconfig.flags = FDB_OPEN_FLAG_RDONLY;
    status = fdb_open(&dbfile_rdonly, "./dummy2", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile_rdonly, &db_rdonly, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_doc_create(&rdoc, doc[0]->key, doc[0]->keylen, NULL, 0, NULL, 0);
    status = fdb_get(db_rdonly, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db_rdonly, logCallbackFunc,
                                  (void *) "basic_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set(db_rdonly, doc[i]);
    TEST_CHK(status == FDB_RESULT_RONLY_VIOLATION);
    TEST_CHK(!strcmp(fdb_error_msg(status), "database is read-only"));

    status = fdb_commit(dbfile_rdonly, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_RONLY_VIOLATION);

    fdb_doc_free(rdoc);
    rdoc = NULL;
    fdb_kvs_close(db_rdonly);
    fdb_close(dbfile_rdonly);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // do one more compaction
    fdb_compact(dbfile, (char *) "./dummy3");

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("basic test");
}